

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_class_override_defaults(writer *w,get_interfaces_t *interfaces)

{
  bool bVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  type *local_50;
  type *info;
  type *name;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
  local_38;
  const_iterator __end1;
  const_iterator __begin1;
  get_interfaces_t *__range1;
  bool first;
  get_interfaces_t *interfaces_local;
  writer *w_local;
  
  bVar1 = true;
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
           ::begin(interfaces);
  local_38._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
          ::end(interfaces);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_38), bVar2) {
    name = &__gnu_cxx::
            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
            ::operator*(&__end1)->first;
    info = (type *)::std::get<0ul,std::__cxx11::string,cppwinrt::interface_info>
                             ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                               *)name);
    local_50 = ::std::get<1ul,std::__cxx11::string,cppwinrt::interface_info>
                         ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                           *)name);
    if ((local_50->overridable & 1U) != 0) {
      if (bVar1) {
        bVar1 = false;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_60,",\n        %T<D>");
        writer_base<cppwinrt::writer>::write<std::__cxx11::string>
                  (&w->super_writer_base<cppwinrt::writer>,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)info);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_70,", %T<D>");
        writer_base<cppwinrt::writer>::write<std::__cxx11::string>
                  (&w->super_writer_base<cppwinrt::writer>,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)info);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void write_class_override_defaults(writer& w, get_interfaces_t const& interfaces)
    {
        bool first = true;

        for (auto&& [name, info] : interfaces)
        {
            if (!info.overridable)
            {
                continue;
            }

            if (first)
            {
                first = false;
                w.write(",\n        %T<D>", name);
            }
            else
            {
                w.write(", %T<D>", name);
            }
        }
    }